

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
::~InternalMetadataWithArenaBase
          (InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = this->ptr_;
  if (((((ulong)pvVar1 & 1) != 0) && (*(long *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x20) == 0))
     && (puVar2 = (undefined8 *)((ulong)pvVar1 & 0xfffffffffffffffe), puVar2 != (undefined8 *)0x0))
  {
    if ((long *)*puVar2 != puVar2 + 2) {
      operator_delete((long *)*puVar2,puVar2[2] + 1);
    }
    operator_delete(puVar2,0x28);
  }
  this->ptr_ = (void *)0x0;
  return;
}

Assistant:

~InternalMetadataWithArenaBase() {
    if (have_unknown_fields() && arena() == NULL) {
      delete PtrValue<Container>();
    }
    ptr_ = NULL;
  }